

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::NegativeDrawCase::iterate(NegativeDrawCase *this)

{
  deUint32 err;
  TestLog *this_00;
  MessageBuilder *pMVar1;
  Enum<int,_2UL> EVar2;
  Enum<int,_2UL> local_1d8 [2];
  MessageBuilder local_1b8;
  int local_34;
  uint local_30;
  GLenum errorCode;
  GLuint vertexPosBuf;
  GLuint vaoId;
  Vec4 vertexPosData;
  GLint attrPosLoc;
  GLuint programId;
  NegativeDrawCase *this_local;
  
  vertexPosData.m_data[3] = (float)(*this->m_ctx->_vptr_Context[0x75])(this->m_ctx,this->m_program);
  vertexPosData.m_data[2] =
       (float)(*this->m_ctx->_vptr_Context[0x59])
                        (this->m_ctx,(ulong)(uint)vertexPosData.m_data[3],"a_position");
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&vertexPosBuf,0.0,0.0,0.0,1.0);
  errorCode = 0;
  local_30 = 0;
  local_34 = 0;
  (*this->m_ctx->_vptr_Context[0x4c])(this->m_ctx,1,&errorCode);
  (*this->m_ctx->_vptr_Context[0x4b])(this->m_ctx,(ulong)errorCode);
  (*this->m_ctx->_vptr_Context[0x26])(this->m_ctx,1,&local_30);
  (*this->m_ctx->_vptr_Context[0x25])(this->m_ctx,0x8892,(ulong)local_30);
  (*this->m_ctx->_vptr_Context[0x28])(this->m_ctx,0x8892,0x10,&vertexPosBuf,0x88e4);
  (*this->m_ctx->_vptr_Context[0x4e])
            (this->m_ctx,(ulong)(uint)vertexPosData.m_data[2],4,0x1406,0,0,0);
  (*this->m_ctx->_vptr_Context[0x50])(this->m_ctx,(ulong)(uint)vertexPosData.m_data[2]);
  (*this->m_ctx->_vptr_Context[0x2a])(0,0,0,0x3f800000);
  (*this->m_ctx->_vptr_Context[0x2d])(this->m_ctx,0x4000);
  (*this->m_ctx->_vptr_Context[5])(this->m_ctx,0,0,1);
  (*this->m_ctx->_vptr_Context[0x76])(this->m_ctx,(ulong)(uint)vertexPosData.m_data[3]);
  err = (*this->m_ctx->_vptr_Context[0x79])();
  glu::checkError(err,"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                  ,0x984);
  (*this->m_ctx->_vptr_Context[0x68])(this->m_ctx,(ulong)this->m_inputPrimitives,0,1);
  local_34 = (*this->m_ctx->_vptr_Context[0x79])();
  if (local_34 == 0x502) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
  }
  else {
    this_00 = tcu::TestContext::getLog
                        ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_1b8,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar1 = tcu::MessageBuilder::operator<<(&local_1b8,(char (*) [36])0x2c11e11);
    EVar2 = glu::getErrorStr(local_34);
    local_1d8[0].m_getName = EVar2.m_getName;
    local_1d8[0].m_value = EVar2.m_value;
    pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,local_1d8);
    tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1b8);
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Got wrong error code");
  }
  (*this->m_ctx->_vptr_Context[0x76])(this->m_ctx,0);
  (*this->m_ctx->_vptr_Context[0x51])(this->m_ctx,(ulong)(uint)vertexPosData.m_data[2]);
  (*this->m_ctx->_vptr_Context[0x27])(this->m_ctx,1,&local_30);
  (*this->m_ctx->_vptr_Context[0x4d])(this->m_ctx,1,&errorCode);
  return STOP;
}

Assistant:

NegativeDrawCase::IterateResult NegativeDrawCase::iterate (void)
{
	const GLuint	programId		= m_ctx->createProgram(m_program);
	const GLint		attrPosLoc		= m_ctx->getAttribLocation(programId, "a_position");
	const tcu::Vec4 vertexPosData	(0, 0, 0, 1);

	GLuint vaoId		= 0;
	GLuint vertexPosBuf = 0;
	GLenum errorCode	= 0;

	m_ctx->genVertexArrays(1, &vaoId);
	m_ctx->bindVertexArray(vaoId);

	m_ctx->genBuffers(1, &vertexPosBuf);
	m_ctx->bindBuffer(GL_ARRAY_BUFFER, vertexPosBuf);
	m_ctx->bufferData(GL_ARRAY_BUFFER, sizeof(tcu::Vec4), vertexPosData.m_data, GL_STATIC_DRAW);
	m_ctx->vertexAttribPointer(attrPosLoc, 4, GL_FLOAT, GL_FALSE, 0, DE_NULL);
	m_ctx->enableVertexAttribArray(attrPosLoc);

	m_ctx->clearColor(0, 0, 0, 1);
	m_ctx->clear(GL_COLOR_BUFFER_BIT);

	m_ctx->viewport(0, 0, 1, 1);

	m_ctx->useProgram(programId);

	// no errors before
	glu::checkError(m_ctx->getError(), "", __FILE__, __LINE__);

	m_ctx->drawArrays(m_inputPrimitives, 0, 1);

	errorCode = m_ctx->getError();
	if (errorCode != GL_INVALID_OPERATION)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Expected GL_INVALID_OPERATION, got " << glu::getErrorStr(errorCode) << tcu::TestLog::EndMessage;
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got wrong error code");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}

	m_ctx->useProgram(0);

	m_ctx->disableVertexAttribArray(attrPosLoc);
	m_ctx->deleteBuffers(1, &vertexPosBuf);

	m_ctx->deleteVertexArrays(1, &vaoId);

	return STOP;
}